

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

uchar fileExists(char *path,uint pathLength)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat fileInfo;
  uint pathLength_local;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._7_1_ = false;
  }
  else {
    fileInfo.__glibc_reserved[2]._4_4_ = pathLength;
    iVar1 = stat(path,(stat *)local_b0);
    path_local._7_1_ = iVar1 == 0;
  }
  return path_local._7_1_;
}

Assistant:

unsigned char fileExists(const char * path, unsigned int pathLength)
{
    (void)pathLength;

    if (path == 0)
    {
        return 0;
    }

#ifdef SYSTEM_WINDOWS

    WIN32_FILE_ATTRIBUTE_DATA fileInfo;
    return (GetFileAttributesExA(path, GetFileExInfoStandard, &fileInfo) != 0);

#else

    struct stat fileInfo;
    return (stat(path, &fileInfo) == 0);

#endif
}